

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::PathArcTo
          (ImDrawList *this,ImVec2 *centre,float radius,float amin,float amax,int num_segments)

{
  float fVar1;
  float fVar2;
  int iVar3;
  float fVar4;
  value_type local_40;
  float local_38;
  
  if ((radius == 0.0) && (!NAN(radius))) {
    ImVector<ImVec2>::push_back(&this->_Path,centre);
  }
  ImVector<ImVec2>::reserve(&this->_Path,num_segments + (this->_Path).Size + 1);
  for (iVar3 = 0; iVar3 <= num_segments; iVar3 = iVar3 + 1) {
    fVar4 = ((float)iVar3 / (float)num_segments) * (amax - amin) + amin;
    fVar1 = centre->x;
    local_38 = cosf(fVar4);
    fVar2 = centre->y;
    fVar4 = sinf(fVar4);
    local_40.y = fVar4 * radius + fVar2;
    local_40.x = local_38 * radius + fVar1;
    ImVector<ImVec2>::push_back(&this->_Path,&local_40);
  }
  return;
}

Assistant:

void ImDrawList::PathArcTo(const ImVec2& centre, float radius, float amin, float amax, int num_segments)
{
    if (radius == 0.0f)
        _Path.push_back(centre);
    _Path.reserve(_Path.Size + (num_segments + 1));
    for (int i = 0; i <= num_segments; i++)
    {
        const float a = amin + ((float)i / (float)num_segments) * (amax - amin);
        _Path.push_back(ImVec2(centre.x + cosf(a) * radius, centre.y + sinf(a) * radius));
    }
}